

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ComputeWorkGroupSizeCase::iterate
          (ComputeWorkGroupSizeCase *this)

{
  bool bVar1;
  int iVar2;
  deBool dVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestLog *pTVar6;
  ProgramSources *pPVar7;
  TestError *pTVar8;
  string *psVar9;
  Vector<int,_3> local_79c;
  string local_790;
  ShaderSource local_770;
  ProgramSources local_748;
  undefined1 local_678 [8];
  ShaderProgram program_2;
  string local_5a0;
  allocator<char> local_579;
  string local_578;
  ScopedLogSection local_558;
  ScopedLogSection section_2;
  string local_540;
  ShaderSource local_520;
  ProgramSources local_4f8;
  undefined1 local_428 [8];
  ShaderProgram program_1;
  string local_350;
  allocator<char> local_329;
  string local_328;
  ScopedLogSection local_308;
  ScopedLogSection section_1;
  string local_2f0;
  ShaderSource local_2d0;
  ProgramSources local_2a8;
  undefined1 local_1d8 [8];
  ShaderProgram program;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  ScopedLogSection local_b8;
  ScopedLogSection section;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  CallLogWrapper gl;
  ComputeWorkGroupSizeCase *this_local;
  
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar2),pTVar6);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar6,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"OneDimensional",&local_d9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"1D",
             (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  psVar9 = &local_100;
  tcu::ScopedLogSection::ScopedLogSection(&local_b8,pTVar6,&local_d8,psVar9);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_2a8);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2f0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\nlayout (local_size_x = 3) in;\nlayout(binding = 0) buffer Output\n{\n\thighp float val;\n} sb_out;\n\nvoid main (void)\n{\n\tsb_out.val = 1.0;\n}\n"
             ,(char *)psVar9);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_2d0,&local_2f0);
  pPVar7 = glu::ProgramSources::operator<<(&local_2a8,&local_2d0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1d8,pRVar5,pPVar7);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  glu::ProgramSources::~ProgramSources(&local_2a8);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar6,(ShaderProgram *)local_1d8);
  while ((dVar3 = ::deGetFalse(), dVar3 == 0 &&
         (bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_1d8), bVar1))) {
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1d8);
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)((long)&section_1.m_log + 4),3,1,1);
      deqp::gls::StateQueryUtil::verifyStateProgramIntegerVec3
                ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,dVar4,0x8267,(IVec3 *)((long)&section_1.m_log + 4),this->m_verifier);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1d8);
      tcu::ScopedLogSection::~ScopedLogSection(&local_b8);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,"TwoDimensional",&local_329);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,"2D",
                 (allocator<char> *)((long)&program_1.m_program.m_info.linkTimeUs + 7));
      psVar9 = &local_350;
      tcu::ScopedLogSection::ScopedLogSection(&local_308,pTVar6,&local_328,psVar9);
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&program_1.m_program.m_info.linkTimeUs + 7));
      std::__cxx11::string::~string((string *)&local_328);
      std::allocator<char>::~allocator(&local_329);
      pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      glu::ProgramSources::ProgramSources(&local_4f8);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_540,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                 (Context *)
                 "${GLSL_VERSION_DECL}\nlayout (local_size_x = 3, local_size_y = 2) in;\nlayout(binding = 0) buffer Output\n{\n\thighp float val;\n} sb_out;\n\nvoid main (void)\n{\n\tsb_out.val = 1.0;\n}\n"
                 ,(char *)psVar9);
      glu::ComputeSource::ComputeSource((ComputeSource *)&local_520,&local_540);
      pPVar7 = glu::ProgramSources::operator<<(&local_4f8,&local_520);
      glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_428,pRVar5,pPVar7);
      glu::ComputeSource::~ComputeSource((ComputeSource *)&local_520);
      std::__cxx11::string::~string((string *)&local_540);
      glu::ProgramSources::~ProgramSources(&local_4f8);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      glu::operator<<(pTVar6,(ShaderProgram *)local_428);
      while ((dVar3 = ::deGetFalse(), dVar3 == 0 &&
             (bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_428), bVar1))) {
        dVar3 = ::deGetFalse();
        if (dVar3 == 0) {
          dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_428);
          tcu::Vector<int,_3>::Vector((Vector<int,_3> *)((long)&section_2.m_log + 4),3,2,1);
          deqp::gls::StateQueryUtil::verifyStateProgramIntegerVec3
                    ((ResultCollector *)local_78,
                     (CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar4,0x8267,
                     (IVec3 *)((long)&section_2.m_log + 4),this->m_verifier);
          glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_428);
          tcu::ScopedLogSection::~ScopedLogSection(&local_308);
          pTVar6 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_578,"TreeDimensional",&local_579);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5a0,"3D",
                     (allocator<char> *)((long)&program_2.m_program.m_info.linkTimeUs + 7));
          psVar9 = &local_5a0;
          tcu::ScopedLogSection::ScopedLogSection(&local_558,pTVar6,&local_578,psVar9);
          std::__cxx11::string::~string((string *)&local_5a0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&program_2.m_program.m_info.linkTimeUs + 7));
          std::__cxx11::string::~string((string *)&local_578);
          std::allocator<char>::~allocator(&local_579);
          pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
          glu::ProgramSources::ProgramSources(&local_748);
          Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                    (&local_790,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                     (Context *)
                     "${GLSL_VERSION_DECL}\nlayout (local_size_x = 3, local_size_y = 2, local_size_z = 4) in;\nlayout(binding = 0) buffer Output\n{\n\thighp float val;\n} sb_out;\n\nvoid main (void)\n{\n\tsb_out.val = 1.0;\n}\n"
                     ,(char *)psVar9);
          glu::ComputeSource::ComputeSource((ComputeSource *)&local_770,&local_790);
          pPVar7 = glu::ProgramSources::operator<<(&local_748,&local_770);
          glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_678,pRVar5,pPVar7);
          glu::ComputeSource::~ComputeSource((ComputeSource *)&local_770);
          std::__cxx11::string::~string((string *)&local_790);
          glu::ProgramSources::~ProgramSources(&local_748);
          pTVar6 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          glu::operator<<(pTVar6,(ShaderProgram *)local_678);
          while ((dVar3 = ::deGetFalse(), dVar3 == 0 &&
                 (bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_678), bVar1))) {
            dVar3 = ::deGetFalse();
            if (dVar3 == 0) {
              dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_678);
              tcu::Vector<int,_3>::Vector(&local_79c,3,2,4);
              deqp::gls::StateQueryUtil::verifyStateProgramIntegerVec3
                        ((ResultCollector *)local_78,
                         (CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar4,0x8267,
                         &local_79c,this->m_verifier);
              glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_678);
              tcu::ScopedLogSection::~ScopedLogSection(&local_558);
              tcu::ResultCollector::setTestContextResult
                        ((ResultCollector *)local_78,
                         (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
              glu::CallLogWrapper::~CallLogWrapper
                        ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
              return STOP;
            }
          }
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,"failed to build program","program.isOk()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                     ,0x210);
          __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,"failed to build program","program.isOk()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                 ,0x205);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,"failed to build program","program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
             ,0x1fa);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

ComputeWorkGroupSizeCase::IterateResult ComputeWorkGroupSizeCase::iterate (void)
{
	static const char* const	s_computeTemplate1D =	"${GLSL_VERSION_DECL}\n"
														"layout (local_size_x = 3) in;\n"
														"layout(binding = 0) buffer Output\n"
														"{\n"
														"	highp float val;\n"
														"} sb_out;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														"	sb_out.val = 1.0;\n"
														"}\n";
	static const char* const	s_computeTemplate2D =	"${GLSL_VERSION_DECL}\n"
														"layout (local_size_x = 3, local_size_y = 2) in;\n"
														"layout(binding = 0) buffer Output\n"
														"{\n"
														"	highp float val;\n"
														"} sb_out;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														"	sb_out.val = 1.0;\n"
														"}\n";
	static const char* const	s_computeTemplate3D =	"${GLSL_VERSION_DECL}\n"
														"layout (local_size_x = 3, local_size_y = 2, local_size_z = 4) in;\n"
														"layout(binding = 0) buffer Output\n"
														"{\n"
														"	highp float val;\n"
														"} sb_out;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														"	sb_out.val = 1.0;\n"
														"}\n";

	glu::CallLogWrapper			gl						(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector		result					(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "OneDimensional", "1D");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, s_computeTemplate1D)));

		m_testCtx.getLog() << program;

		TCU_CHECK_MSG(program.isOk(), "failed to build program");

		verifyStateProgramIntegerVec3(result, gl, program.getProgram(), GL_COMPUTE_WORK_GROUP_SIZE, tcu::IVec3(3, 1, 1), m_verifier);
	}

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "TwoDimensional", "2D");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, s_computeTemplate2D)));

		m_testCtx.getLog() << program;

		TCU_CHECK_MSG(program.isOk(), "failed to build program");

		verifyStateProgramIntegerVec3(result, gl, program.getProgram(), GL_COMPUTE_WORK_GROUP_SIZE, tcu::IVec3(3, 2, 1), m_verifier);
	}

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "TreeDimensional", "3D");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, s_computeTemplate3D)));

		m_testCtx.getLog() << program;

		TCU_CHECK_MSG(program.isOk(), "failed to build program");

		verifyStateProgramIntegerVec3(result, gl, program.getProgram(), GL_COMPUTE_WORK_GROUP_SIZE, tcu::IVec3(3, 2, 4), m_verifier);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}